

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadDsd.c
# Opt level: O1

Abc_Ntk_t * Io_ReadDsd(char *pForm)

{
  int iVar1;
  char *pcVar2;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *vNames;
  Abc_Obj_t *pAVar3;
  size_t sVar4;
  byte *pbVar5;
  Abc_Obj_t *pObj;
  byte bVar6;
  uint nNames;
  Abc_Ntk_t *pAVar8;
  ulong uVar9;
  char cVar7;
  
  cVar7 = *pForm;
  if (cVar7 == '\0') {
    nNames = 1;
  }
  else {
    pcVar2 = pForm + 1;
    iVar1 = 0;
    do {
      bVar6 = cVar7 + 0x9f;
      if ((bVar6 < 0x1a) && (iVar1 <= (char)bVar6)) {
        iVar1 = (int)(char)bVar6;
      }
      cVar7 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar7 != '\0');
    nNames = iVar1 + 1;
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar2 = Extra_UtilStrsav("dsd");
  pNtk->pName = pcVar2;
  vNames = Abc_NodeGetFakeNames(nNames);
  uVar9 = 0;
  do {
    pAVar3 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
    if ((long)vNames->nSize <= (long)uVar9) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    Abc_ObjAssignName(pAVar3,(char *)vNames->pArray[uVar9],(char *)0x0);
    uVar9 = uVar9 + 1;
  } while (nNames != uVar9);
  Abc_NodeFreeNames(vNames);
  sVar4 = strlen(pForm);
  pcVar2 = (char *)malloc(sVar4 * 3 + 10);
  *pcVar2 = '(';
  pbVar5 = (byte *)(pcVar2 + 1);
  do {
    bVar6 = *pForm;
    if (bVar6 < 0x29) {
      if (bVar6 == 0x28) {
        pbVar5[0] = 0x28;
        pbVar5[1] = 0x28;
        goto LAB_002d33a0;
      }
      if (bVar6 == 0) {
        pbVar5[0] = 0x29;
        pbVar5[1] = 0;
        pAVar3 = Io_ReadDsd_rec(pNtk,pcVar2,(char *)0x0);
        free(pcVar2);
        pAVar8 = (Abc_Ntk_t *)0x0;
        if (pAVar3 != (Abc_Obj_t *)0x0) {
          pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
          Abc_ObjAssignName(pObj,"F",(char *)0x0);
          Abc_ObjAddFanin(pObj,pAVar3);
          iVar1 = Abc_NtkCheck(pNtk);
          pAVar8 = pNtk;
          if (iVar1 == 0) {
            fwrite("Io_ReadDsd(): Network check has failed.\n",0x28,1,_stdout);
            Abc_NtkDelete(pNtk);
            pAVar8 = (Abc_Ntk_t *)0x0;
          }
        }
        return pAVar8;
      }
LAB_002d33aa:
      *pbVar5 = bVar6;
      pbVar5 = pbVar5 + 1;
    }
    else if (bVar6 == 0x29) {
      pbVar5[0] = 0x29;
      pbVar5[1] = 0x29;
LAB_002d33a0:
      pbVar5 = pbVar5 + 2;
    }
    else {
      if (bVar6 != 0x2c) goto LAB_002d33aa;
      pbVar5[0] = 0x29;
      pbVar5[1] = 0x2c;
      pbVar5[2] = 0x28;
      pbVar5 = pbVar5 + 3;
    }
    pForm = (char *)((byte *)pForm + 1);
  } while( true );
}

Assistant:

Abc_Ntk_t * Io_ReadDsd( char * pForm )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObj, * pTop;
    Vec_Ptr_t * vNames;
    char * pCur, * pFormCopy;
    int i, nInputs;

    // count the number of elementary variables
    nInputs = 0;
    for ( pCur = pForm; *pCur; pCur++ )
        if ( *pCur >= 'a' && *pCur <= 'z' )
            nInputs = Abc_MaxInt( nInputs, *pCur - 'a' );
    nInputs++;

    // create the network
    pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    pNtk->pName = Extra_UtilStrsav( "dsd" );

    // create PIs
    vNames = Abc_NodeGetFakeNames( nInputs );
    for ( i = 0; i < nInputs; i++ )
        Abc_ObjAssignName( Abc_NtkCreatePi(pNtk), (char *)Vec_PtrEntry(vNames, i), NULL );
    Abc_NodeFreeNames( vNames );

    // transform the formula by inserting parentheses
    // this transforms strings like PRIME(a,b,cd) into (PRIME((a),(b),(cd)))
    pCur = pFormCopy = ABC_ALLOC( char, 3 * strlen(pForm) + 10 );
    *pCur++ = '(';
    for ( ; *pForm; pForm++ )
        if ( *pForm == '(' )
        {
            *pCur++ = '(';
            *pCur++ = '(';
        }
        else if ( *pForm == ')' )
        {
            *pCur++ = ')';
            *pCur++ = ')';
        }
        else if ( *pForm == ',' )
        {
            *pCur++ = ')';
            *pCur++ = ',';
            *pCur++ = '(';
        }
        else
            *pCur++ = *pForm;
    *pCur++ = ')';
    *pCur = 0;

    // parse the formula
    pObj = Io_ReadDsd_rec( pNtk, pFormCopy, NULL );
    ABC_FREE( pFormCopy );
    if ( pObj == NULL )
        return NULL;

    // create output
    pTop = Abc_NtkCreatePo(pNtk);
    Abc_ObjAssignName( pTop, "F", NULL );
    Abc_ObjAddFanin( pTop, pObj );

    // create the only PO
    if ( !Abc_NtkCheck( pNtk ) )
    {
        fprintf( stdout, "Io_ReadDsd(): Network check has failed.\n" );
        Abc_NtkDelete( pNtk );
        return NULL;
    }
    return pNtk;
}